

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O0

ExprTree * __thiscall
PcodeCompile::createOpOutUnary(PcodeCompile *this,VarnodeTpl *outvn,OpCode opc,ExprTree *vn)

{
  OpTpl *this_00;
  VarnodeTpl *this_01;
  OpTpl *local_30;
  OpTpl *op;
  ExprTree *vn_local;
  VarnodeTpl *pVStack_18;
  OpCode opc_local;
  VarnodeTpl *outvn_local;
  PcodeCompile *this_local;
  
  op = (OpTpl *)vn;
  vn_local._4_4_ = opc;
  pVStack_18 = outvn;
  outvn_local = (VarnodeTpl *)this;
  this_00 = (OpTpl *)operator_new(0x28);
  OpTpl::OpTpl(this_00,vn_local._4_4_);
  local_30 = this_00;
  OpTpl::addInput(this_00,*(VarnodeTpl **)&op->opc);
  OpTpl::setOutput(local_30,pVStack_18);
  std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::push_back
            ((vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)op->output,&local_30);
  this_01 = (VarnodeTpl *)operator_new(0x68);
  VarnodeTpl::VarnodeTpl(this_01,pVStack_18);
  *(VarnodeTpl **)&op->opc = this_01;
  return (ExprTree *)op;
}

Assistant:

ExprTree *PcodeCompile::createOpOutUnary(VarnodeTpl *outvn,OpCode opc,ExprTree *vn)

{ // Create an op with explicit output and 1 input
  OpTpl *op = new OpTpl(opc);
  op->addInput(vn->outvn);
  op->setOutput(outvn);
  vn->ops->push_back(op);
  vn->outvn = new VarnodeTpl(*outvn);
  return vn;
}